

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  pointer pcVar1;
  
  (this->m_info).macroName._M_dataplus._M_p = (pointer)&(this->m_info).macroName.field_2;
  pcVar1 = (info->macroName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (info->macroName)._M_string_length);
  (this->m_info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->m_info).lineInfo.file.field_2;
  pcVar1 = (info->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).lineInfo,pcVar1,
             pcVar1 + (info->lineInfo).file._M_string_length);
  (this->m_info).lineInfo.line = (info->lineInfo).line;
  (this->m_info).capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_info).capturedExpression.field_2;
  pcVar1 = (info->capturedExpression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).capturedExpression,pcVar1,
             pcVar1 + (info->capturedExpression)._M_string_length);
  (this->m_info).resultDisposition = info->resultDisposition;
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_resultData).reconstructedExpression.field_2;
  pcVar1 = (data->reconstructedExpression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_resultData,pcVar1,
             pcVar1 + (data->reconstructedExpression)._M_string_length);
  (this->m_resultData).message._M_dataplus._M_p = (pointer)&(this->m_resultData).message.field_2;
  pcVar1 = (data->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_resultData).message,pcVar1,
             pcVar1 + (data->message)._M_string_length);
  (this->m_resultData).resultType = data->resultType;
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}